

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

void Curl_pollset_check(Curl_easy *data,easy_pollset *ps,curl_socket_t sock,_Bool *pwant_read,
                       _Bool *pwant_write)

{
  uint local_34;
  uint i;
  _Bool *pwant_write_local;
  _Bool *pwant_read_local;
  curl_socket_t sock_local;
  easy_pollset *ps_local;
  Curl_easy *data_local;
  
  local_34 = 0;
  while( true ) {
    if (ps->num <= local_34) {
      *pwant_write = false;
      *pwant_read = false;
      return;
    }
    if (ps->sockets[local_34] == sock) break;
    local_34 = local_34 + 1;
  }
  *pwant_read = (ps->actions[local_34] & 1) != 0;
  *pwant_write = (ps->actions[local_34] & 2) != 0;
  return;
}

Assistant:

void Curl_pollset_check(struct Curl_easy *data,
                        struct easy_pollset *ps, curl_socket_t sock,
                        bool *pwant_read, bool *pwant_write)
{
  unsigned int i;

  (void)data;
  DEBUGASSERT(VALID_SOCK(sock));
  for(i = 0; i < ps->num; ++i) {
    if(ps->sockets[i] == sock) {
      *pwant_read = !!(ps->actions[i] & CURL_POLL_IN);
      *pwant_write = !!(ps->actions[i] & CURL_POLL_OUT);
      return;
    }
  }
  *pwant_read = *pwant_write = FALSE;
}